

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<tinyusdz::value::half,3ul>>
          (Attribute *this,array<tinyusdz::value::half,_3UL> *v)

{
  value_type *pvVar1;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_30;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_28;
  optional<std::array<tinyusdz::value::half,_3UL>_> ret;
  array<tinyusdz::value::half,_3UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<tinyusdz::value::half,_3UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret = (optional<std::array<tinyusdz::value::half,_3UL>_>)v;
    primvar::PrimVar::get_value<std::array<tinyusdz::value::half,3ul>>(&local_30,&this->_var);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
    optional<std::array<tinyusdz::value::half,_3UL>,_0>(&local_28,&local_30);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_30);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_28)
    ;
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                         (&local_28);
      *(undefined4 *)ret = *(undefined4 *)pvVar1->_M_elems;
      *(uint16_t *)((long)ret + 4) = pvVar1->_M_elems[2].value;
    }
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_28);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }